

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O1

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:150:25)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:150:25)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *this_00;
  TutorialApplication *this_01;
  ParseStream *this_02;
  LineCommentFilter *this_03;
  FileName file;
  Ref<embree::Stream<int>_> local_e0;
  Ref<embree::ParseStream> local_d8;
  string local_d0;
  FileName local_b0;
  FileName local_90;
  string local_70;
  string local_50;
  
  this_00 = cin->ptr;
  if (this_00 != (ParseStream *)0x0) {
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
  }
  this_01 = (this->f).this;
  ParseStream::getFileName((FileName *)&local_d0,this_00);
  FileName::operator+(&local_b0,path,(FileName *)&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  this_02 = (ParseStream *)operator_new(0x48);
  this_03 = (LineCommentFilter *)operator_new(0x68);
  local_d0.field_2._M_allocated_capacity._0_2_ = 0x23;
  local_d0._M_string_length = 1;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  LineCommentFilter::LineCommentFilter(this_03,&local_b0,&local_d0);
  local_e0.ptr = (Stream<int> *)this_03;
  (*(this_03->super_Stream<int>).super_RefCount._vptr_RefCount[2])(this_03);
  local_50.field_2._M_allocated_capacity._0_4_ = 0x200d090a;
  local_50._M_string_length = 4;
  local_50.field_2._M_local_buf[4] = '\0';
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ParseStream::ParseStream(this_02,&local_e0,&local_50,&local_70,false);
  local_d8.ptr = this_02;
  (*(this_02->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[2])(this_02);
  FileName::path(&local_90,&local_b0);
  Application::parseCommandLine(&this_01->super_Application,&local_d8,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.filename._M_dataplus._M_p != &local_90.filename.field_2) {
    operator_delete(local_90.filename._M_dataplus._M_p);
  }
  if (local_d8.ptr != (ParseStream *)0x0) {
    (*((local_d8.ptr)->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[3])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((LineCommentFilter *)local_e0.ptr != (LineCommentFilter *)0x0) {
    (*(((Stream<int> *)&(local_e0.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.filename._M_dataplus._M_p != &local_b0.filename.field_2) {
    operator_delete(local_b0.filename._M_dataplus._M_p);
  }
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this_00);
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }